

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::literal::scan(literal *this,location *loc)

{
  bool bVar1;
  byte bVar2;
  location *in_RSI;
  region *in_RDI;
  size_t i;
  location first;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  region *n;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  location *in_stack_ffffffffffffff90;
  location *first_00;
  region *in_stack_ffffffffffffffa0;
  
  n = in_RDI;
  location::location(in_stack_ffffffffffffff90,
                     (location *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  first_00 = (location *)0x0;
  do {
    if ((location *)(in_RSI->source_name_)._M_dataplus._M_p <= first_00) {
      region::region(in_stack_ffffffffffffffa0,first_00,in_stack_ffffffffffffff90);
LAB_001fc289:
      location::~location((location *)in_RDI);
      return n;
    }
    bVar1 = location::eof((location *)in_RDI);
    if (bVar1) {
LAB_001fc1ff:
      location::operator=((location *)in_RDI,
                          (location *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
      ;
      region::region(in_stack_ffffffffffffffa0);
      goto LAB_001fc289;
    }
    in_stack_ffffffffffffff68 =
         (uint)*(byte *)((long)&(first_00->source_).
                                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr +
                        (long)&((in_RSI->source_).
                                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_vptr__Sp_counted_base);
    bVar2 = location::current((location *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff6c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff6c);
    if (in_stack_ffffffffffffff68 != bVar2) goto LAB_001fc1ff;
    location::advance(in_RSI,(size_t)n);
    first_00 = (location *)
               ((long)&(first_00->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 1);
  } while( true );
}

Assistant:

TOML11_INLINE region literal::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<size_; ++i)
    {
        if(loc.eof() || char_type(value_[i]) != loc.current())
        {
            loc = first;
            return region{};
        }
        loc.advance(1);
    }
    return region(first, loc);
}